

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O1

int __thiscall cursespp::ShortcutsWindow::getActiveIndex(ShortcutsWindow *this)

{
  pointer __s2;
  size_t sVar1;
  element_type *peVar2;
  size_t __n;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  pointer psVar6;
  
  psVar6 = (this->entries).
           super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(this->entries).
                               super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6) >> 4);
  if (0 < (int)uVar5) {
    __s2 = (this->activeKey)._M_dataplus._M_p;
    sVar1 = (this->activeKey)._M_string_length;
    uVar4 = 0;
    do {
      peVar2 = (psVar6->
               super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      __n = *(size_type *)((long)&peVar2->key + 8);
      if ((__n == sVar1) &&
         ((__n == 0 || (iVar3 = bcmp((peVar2->key)._M_dataplus._M_p,__s2,__n), iVar3 == 0)))) {
        return (int)uVar4;
      }
      uVar4 = uVar4 + 1;
      psVar6 = psVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar4);
  }
  return -1;
}

Assistant:

int ShortcutsWindow::getActiveIndex() {
    for (int i = 0; i < (int) this->entries.size(); i++) {
        if (this->entries[i]->key == this->activeKey) {
            return i;
        }
    }
    return -1;
}